

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O1

void __thiscall
beagle::cpu::EigenDecompositionSquare<float,_1>::setEigenDecomposition
          (EigenDecompositionSquare<float,_1> *this,int eigenIndex,double *inEigenVectors,
          double *inInverseEigenVectors,double *inEigenValues)

{
  double *pdVar1;
  uint uVar2;
  float fVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float *pfVar12;
  ulong uVar13;
  float *pfVar14;
  ulong uVar15;
  ulong uVar16;
  float *pfVar17;
  ulong uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  
  uVar2 = this->kEigenValuesSize;
  if ((ulong)uVar2 != 0) {
    pfVar12 = (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex];
    auVar20 = vpbroadcastq_avx512f();
    uVar16 = 0;
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar22 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar22,auVar21);
      uVar13 = vpcmpuq_avx512f(auVar22,auVar20,2);
      pdVar1 = inEigenValues + uVar16;
      auVar22._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * (long)pdVar1[1];
      auVar22._0_8_ = (ulong)((byte)uVar13 & 1) * (long)*pdVar1;
      auVar22._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * (long)pdVar1[2];
      auVar22._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * (long)pdVar1[3];
      auVar22._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * (long)pdVar1[4];
      auVar22._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * (long)pdVar1[5];
      auVar22._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * (long)pdVar1[6];
      auVar22._56_8_ = (uVar13 >> 7) * (long)pdVar1[7];
      auVar19 = vcvtpd2ps_avx512f(auVar22);
      pfVar14 = pfVar12 + uVar16;
      bVar4 = (bool)((byte)uVar13 & 1);
      bVar5 = (bool)((byte)(uVar13 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar13 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar13 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar13 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar13 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar13 >> 6) & 1);
      bVar11 = SUB81(uVar13 >> 7,0);
      *pfVar14 = (float)((uint)bVar4 * auVar19._0_4_ | (uint)!bVar4 * (int)*pfVar14);
      pfVar14[1] = (float)((uint)bVar5 * auVar19._4_4_ | (uint)!bVar5 * (int)pfVar14[1]);
      pfVar14[2] = (float)((uint)bVar6 * auVar19._8_4_ | (uint)!bVar6 * (int)pfVar14[2]);
      pfVar14[3] = (float)((uint)bVar7 * auVar19._12_4_ | (uint)!bVar7 * (int)pfVar14[3]);
      pfVar14[4] = (float)((uint)bVar8 * auVar19._16_4_ | (uint)!bVar8 * (int)pfVar14[4]);
      pfVar14[5] = (float)((uint)bVar9 * auVar19._20_4_ | (uint)!bVar9 * (int)pfVar14[5]);
      pfVar14[6] = (float)((uint)bVar10 * auVar19._24_4_ | (uint)!bVar10 * (int)pfVar14[6]);
      pfVar14[7] = (float)((uint)bVar11 * auVar19._28_4_ | (uint)!bVar11 * (int)pfVar14[7]);
      uVar16 = uVar16 + 8;
    } while (((ulong)uVar2 + 7 & 0xfffffffffffffff8) != uVar16);
  }
  uVar2 = (this->super_EigenDecomposition<float,_1>).kStateCount;
  uVar16 = (ulong)uVar2;
  if (uVar16 != 0) {
    pfVar12 = this->gEMatrices[eigenIndex];
    auVar20 = vpbroadcastq_avx512f();
    uVar13 = 0;
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar22 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar22,auVar21);
      uVar15 = vpcmpuq_avx512f(auVar22,auVar20,2);
      pdVar1 = inEigenVectors + uVar13;
      auVar23._8_8_ = (ulong)((byte)(uVar15 >> 1) & 1) * (long)pdVar1[1];
      auVar23._0_8_ = (ulong)((byte)uVar15 & 1) * (long)*pdVar1;
      auVar23._16_8_ = (ulong)((byte)(uVar15 >> 2) & 1) * (long)pdVar1[2];
      auVar23._24_8_ = (ulong)((byte)(uVar15 >> 3) & 1) * (long)pdVar1[3];
      auVar23._32_8_ = (ulong)((byte)(uVar15 >> 4) & 1) * (long)pdVar1[4];
      auVar23._40_8_ = (ulong)((byte)(uVar15 >> 5) & 1) * (long)pdVar1[5];
      auVar23._48_8_ = (ulong)((byte)(uVar15 >> 6) & 1) * (long)pdVar1[6];
      auVar23._56_8_ = (uVar15 >> 7) * (long)pdVar1[7];
      auVar19 = vcvtpd2ps_avx512f(auVar23);
      pfVar14 = pfVar12 + uVar13;
      bVar4 = (bool)((byte)uVar15 & 1);
      bVar5 = (bool)((byte)(uVar15 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar15 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar15 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar15 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar15 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar15 >> 6) & 1);
      bVar11 = SUB81(uVar15 >> 7,0);
      *pfVar14 = (float)((uint)bVar4 * auVar19._0_4_ | (uint)!bVar4 * (int)*pfVar14);
      pfVar14[1] = (float)((uint)bVar5 * auVar19._4_4_ | (uint)!bVar5 * (int)pfVar14[1]);
      pfVar14[2] = (float)((uint)bVar6 * auVar19._8_4_ | (uint)!bVar6 * (int)pfVar14[2]);
      pfVar14[3] = (float)((uint)bVar7 * auVar19._12_4_ | (uint)!bVar7 * (int)pfVar14[3]);
      pfVar14[4] = (float)((uint)bVar8 * auVar19._16_4_ | (uint)!bVar8 * (int)pfVar14[4]);
      pfVar14[5] = (float)((uint)bVar9 * auVar19._20_4_ | (uint)!bVar9 * (int)pfVar14[5]);
      pfVar14[6] = (float)((uint)bVar10 * auVar19._24_4_ | (uint)!bVar10 * (int)pfVar14[6]);
      pfVar14[7] = (float)((uint)bVar11 * auVar19._28_4_ | (uint)!bVar11 * (int)pfVar14[7]);
      uVar13 = uVar13 + 8;
    } while ((uVar2 * uVar2 + 7 & 0xfffffff8) != uVar13);
  }
  pfVar12 = this->gIMatrices[eigenIndex];
  if (uVar16 != 0) {
    auVar20 = vpbroadcastq_avx512f();
    uVar13 = 0;
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar22 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar22,auVar21);
      uVar15 = vpcmpuq_avx512f(auVar22,auVar20,2);
      pdVar1 = inInverseEigenVectors + uVar13;
      auVar24._8_8_ = (ulong)((byte)(uVar15 >> 1) & 1) * (long)pdVar1[1];
      auVar24._0_8_ = (ulong)((byte)uVar15 & 1) * (long)*pdVar1;
      auVar24._16_8_ = (ulong)((byte)(uVar15 >> 2) & 1) * (long)pdVar1[2];
      auVar24._24_8_ = (ulong)((byte)(uVar15 >> 3) & 1) * (long)pdVar1[3];
      auVar24._32_8_ = (ulong)((byte)(uVar15 >> 4) & 1) * (long)pdVar1[4];
      auVar24._40_8_ = (ulong)((byte)(uVar15 >> 5) & 1) * (long)pdVar1[5];
      auVar24._48_8_ = (ulong)((byte)(uVar15 >> 6) & 1) * (long)pdVar1[6];
      auVar24._56_8_ = (uVar15 >> 7) * (long)pdVar1[7];
      auVar19 = vcvtpd2ps_avx512f(auVar24);
      pfVar14 = pfVar12 + uVar13;
      bVar4 = (bool)((byte)uVar15 & 1);
      bVar5 = (bool)((byte)(uVar15 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar15 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar15 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar15 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar15 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar15 >> 6) & 1);
      bVar11 = SUB81(uVar15 >> 7,0);
      *pfVar14 = (float)((uint)bVar4 * auVar19._0_4_ | (uint)!bVar4 * (int)*pfVar14);
      pfVar14[1] = (float)((uint)bVar5 * auVar19._4_4_ | (uint)!bVar5 * (int)pfVar14[1]);
      pfVar14[2] = (float)((uint)bVar6 * auVar19._8_4_ | (uint)!bVar6 * (int)pfVar14[2]);
      pfVar14[3] = (float)((uint)bVar7 * auVar19._12_4_ | (uint)!bVar7 * (int)pfVar14[3]);
      pfVar14[4] = (float)((uint)bVar8 * auVar19._16_4_ | (uint)!bVar8 * (int)pfVar14[4]);
      pfVar14[5] = (float)((uint)bVar9 * auVar19._20_4_ | (uint)!bVar9 * (int)pfVar14[5]);
      pfVar14[6] = (float)((uint)bVar10 * auVar19._24_4_ | (uint)!bVar10 * (int)pfVar14[6]);
      pfVar14[7] = (float)((uint)bVar11 * auVar19._28_4_ | (uint)!bVar11 * (int)pfVar14[7]);
      uVar13 = uVar13 + 8;
    } while ((uVar2 * uVar2 + 7 & 0xfffffff8) != uVar13);
  }
  if ((1 < (int)uVar2) && (((this->super_EigenDecomposition<float,_1>).kFlags & 0x200000U) != 0)) {
    pfVar14 = pfVar12 + uVar16;
    pfVar12 = pfVar12 + 1;
    uVar15 = 0;
    uVar13 = uVar16;
    do {
      uVar13 = uVar13 - 1;
      uVar18 = 0;
      pfVar17 = pfVar14;
      do {
        fVar3 = pfVar12[uVar18];
        pfVar12[uVar18] = *pfVar17;
        *pfVar17 = fVar3;
        uVar18 = uVar18 + 1;
        pfVar17 = pfVar17 + uVar16;
      } while (uVar13 != uVar18);
      uVar15 = uVar15 + 1;
      pfVar12 = pfVar12 + uVar16 + 1;
      pfVar14 = pfVar14 + uVar16 + 1;
    } while (uVar15 != uVar2 - 1);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::setEigenDecomposition(int eigenIndex,
										             const double* inEigenVectors,
                                                     const double* inInverseEigenVectors,
                                                     const double* inEigenValues) {
    
	beagleMemCpy(gEigenValues[eigenIndex],inEigenValues,kEigenValuesSize);
	const int len = kStateCount * kStateCount;
	beagleMemCpy(gEMatrices[eigenIndex],inEigenVectors,len);
	beagleMemCpy(gIMatrices[eigenIndex],inInverseEigenVectors,len);
    if (kFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED) // TODO: optimize, might not need to transpose here
        transposeSquareMatrix(gIMatrices[eigenIndex], kStateCount);
}